

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTOpenGlider.cpp
# Opt level: O0

string * __thiscall OpenGliderConnection::GetStatusText_abi_cxx11_(OpenGliderConnection *this)

{
  uint uVar1;
  long in_RSI;
  string *in_RDI;
  float fVar2;
  LTChannel *in_stack_00000018;
  char buf [50];
  string *s;
  DataRefs *this_00;
  undefined1 local_11;
  
  local_11 = 0;
  LTChannel::GetStatusText_abi_cxx11_(in_stack_00000018);
  uVar1 = std::isnan((double)(ulong)*(uint *)(in_RSI + 0x2b8));
  if ((uVar1 & 1) == 0) {
    this_00 = (DataRefs *)&stack0xffffffffffffffa8;
    fVar2 = DataRefs::GetMiscNetwTime(this_00);
    snprintf((char *)this_00,0x32," | last msg %.0fs ago",
             (double)(fVar2 - *(float *)(in_RSI + 0x2b8)));
    std::__cxx11::string::operator+=((string *)in_RDI,&stack0xffffffffffffffa8);
  }
  return in_RDI;
}

Assistant:

std::string OpenGliderConnection::GetStatusText () const
{
    // Let's start with the standard text
    std::string s (LTChannel::GetStatusText());
    // if we have a latest APRS timestamp then we add age of last APRS message
    if (!std::isnan(aprsLastData)) {
        char buf[50];
        snprintf(buf, sizeof(buf), " | last msg %.0fs ago",
                 dataRefs.GetMiscNetwTime() - aprsLastData);
        s += buf;
    }
    return s;
}